

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

CTcSymbol * CTcSymbolBase::read_from_sym_file(CVmFile *fp)

{
  undefined8 in_RAX;
  CTcSymbol *pCVar1;
  char b [2];
  ushort local_12;
  
  local_12 = (ushort)((ulong)in_RAX >> 0x30);
  CVmFile::read_bytes(fp,(char *)&local_12,2);
  switch(local_12) {
  case 1:
    pCVar1 = CTcSymFuncBase::read_from_sym_file(fp);
    break;
  case 2:
    pCVar1 = CTcSymObjBase::read_from_sym_file(fp);
    break;
  case 3:
    pCVar1 = CTcSymPropBase::read_from_sym_file(fp);
    break;
  default:
    pCVar1 = (CTcSymbol *)0x0;
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2db4);
    break;
  case 9:
    pCVar1 = CTcSymMetaclassBase::read_from_sym_file(fp);
    break;
  case 10:
    pCVar1 = CTcSymEnumBase::read_from_sym_file(fp);
  }
  return pCVar1;
}

Assistant:

CTcSymbol *CTcSymbolBase::read_from_sym_file(CVmFile *fp)
{
    /* 
     *   read the type - this is the one thing we know is always present for
     *   every symbol (the rest of the data might vary per subclass) 
     */
    tc_symtype_t typ = (tc_symtype_t)fp->read_uint2();

    /* create the object based on the type */
    switch(typ)
    {
    case TC_SYM_FUNC:
        return CTcSymFunc::read_from_sym_file(fp);

    case TC_SYM_OBJ:
        return CTcSymObj::read_from_sym_file(fp);

    case TC_SYM_PROP:
        return CTcSymProp::read_from_sym_file(fp);

    case TC_SYM_ENUM:
        return CTcSymEnum::read_from_sym_file(fp);

    case TC_SYM_METACLASS:
        return CTcSymMetaclass::read_from_sym_file(fp);

    default:
        /* other types should not be in a symbol file */
        G_tcmain->log_error(0, 0, TC_SEV_ERROR, TCERR_SYMEXP_INV_TYPE);
        return 0;
    }
}